

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

bool __thiscall
llvm::cl::opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_>::
handleOccurrence(opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *this
                ,uint pos,StringRef ArgName,StringRef Arg)

{
  bool bVar1;
  CommandLineParser *pCVar2;
  opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true> *this_00;
  HelpPrinterWrapper *pHVar3;
  parser_data_type Val;
  
  Val = false;
  bVar1 = parser<bool>::parse((parser<bool> *)this,&this->super_Option,ArgName,Arg,&Val);
  if (!bVar1) {
    this_00 = &this->super_opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>;
    opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>::check_location(this_00);
    if (Val == true) {
      pHVar3 = (this->super_opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>).
               Location;
      pCVar2 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
               ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                             *)this_00);
      if (1 < (pCVar2->RegisteredOptionCategories).super_SmallPtrSetImpl<llvm::cl::OptionCategory_*>
              .super_SmallPtrSetImplBase.NumNonEmpty -
              (pCVar2->RegisteredOptionCategories).super_SmallPtrSetImpl<llvm::cl::OptionCategory_*>
              .super_SmallPtrSetImplBase.NumTombstones) {
        HLOp.super_Option._12_1_ = HLOp.super_Option._12_1_ & 0x9f;
        pHVar3 = (HelpPrinterWrapper *)&pHVar3->CategorizedPrinter;
      }
      anon_unknown.dwarf_2b097::HelpPrinter::operator=(pHVar3->UncategorizedPrinter,true);
    }
    (this->super_Option).Position = pos;
  }
  return bVar1;
}

Assistant:

bool handleOccurrence(unsigned pos, StringRef ArgName,
                        StringRef Arg) override {
    typename ParserClass::parser_data_type Val =
        typename ParserClass::parser_data_type();
    if (Parser.parse(*this, ArgName, Arg, Val))
      return true; // Parse error!
    this->setValue(Val);
    this->setPosition(pos);
    return false;
  }